

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DynamicViewportIndex::checkResults
          (DynamicViewportIndex *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  bool bVar1;
  uint expected_value;
  GLuint y;
  uint y_00;
  uint uVar2;
  GLuint x;
  GLuint x_00;
  vector<int,_std::allocator<int>_> texture_data;
  
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&texture_data,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  uVar2 = 0;
  for (y_00 = 0; y_00 != 4; y_00 = y_00 + 1) {
    for (x_00 = 0; expected_value = x_00 + uVar2, x_00 != 4; x_00 = x_00 + 1) {
      if (draw_call_index < expected_value) {
        expected_value = 0xffffffff;
      }
      bVar1 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,x_00,y_00,expected_value,
                         texture_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if (!bVar1) goto LAB_00d92fd8;
    }
    uVar2 = expected_value;
  }
LAB_00d92fd8:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&texture_data.super__Vector_base<int,_std::allocator<int>_>);
  return 3 < y_00;
}

Assistant:

bool DynamicViewportIndex::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										GLuint			draw_call_index)
{
	bool   check_result = true;
	GLuint index		= 0;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			GLint expected_value = -1;
			if (index <= draw_call_index)
			{
				expected_value = index;
			}

			bool result = checkRegionR32I(x, y, expected_value, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}

			index += 1;
		}
	}

end:
	return check_result;
}